

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Record.cpp
# Opt level: O3

void __thiscall KDIS::UTILS::DIS_Logger_Record::Save(DIS_Logger_Record *this)

{
  pointer pbVar1;
  pointer S;
  
  S = (this->m_vsLog).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_vsLog).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (S != pbVar1) {
    do {
      writeToFile(this,S);
      S = S + 1;
    } while (S != pbVar1);
    S = (this->m_vsLog).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->m_vsLog,S);
  return;
}

Assistant:

void DIS_Logger_Record::Save() noexcept(false)
{
    vector<KString>::const_iterator citr = m_vsLog.begin();
    vector<KString>::const_iterator citrEnd = m_vsLog.end();

    for( ; citr != citrEnd; ++citr )
    {
        writeToFile( *citr );
    }

    Clear();
}